

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O2

void * __thiscall
chrono::ChClassFactory::_archive_in_create
          (ChClassFactory *this,string *keyName,ChArchiveIn *marchive)

{
  iterator iVar1;
  void *pvVar2;
  ChException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this,keyName);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*>,_true>
      ._M_cur != (__node_type *)0x0) {
    pvVar2 = (void *)(**(code **)(**(long **)((long)iVar1.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*>,_true>
                                                  ._M_cur + 0x28) + 8))
                               (*(long **)((long)iVar1.
                                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*>,_true>
                                                 ._M_cur + 0x28),marchive);
    return pvVar2;
  }
  this_00 = (ChException *)__cxa_allocate_exception(0x28);
  std::operator+(&bStack_58,"ChClassFactory::create() cannot find the class with name ",keyName);
  std::operator+(&local_38,&bStack_58,". Please register it.\n");
  ChException::ChException(this_00,&local_38);
  __cxa_throw(this_00,&ChException::typeinfo,ChException::~ChException);
}

Assistant:

void* _archive_in_create(const std::string& keyName, ChArchiveIn& marchive) {
        const auto &it = class_map.find(keyName);
        if (it != class_map.end()) {
            return it->second->create(marchive);
        }
        throw ( ChException("ChClassFactory::create() cannot find the class with name " + keyName + ". Please register it.\n") );
    }